

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

MaybeResult<wasm::Continuation> *
wasm::WATParser::conttype<wasm::WATParser::ParseTypeDefsCtx>
          (MaybeResult<wasm::Continuation> *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  Lexer *this;
  undefined8 *puVar1;
  HeapType HVar2;
  bool bVar3;
  string_view expected;
  undefined1 local_b8 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT> x;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  string local_70;
  undefined1 local_50 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT> _val;
  
  this = &ctx->in;
  expected._M_str = "cont";
  expected._M_len = 4;
  bVar3 = Lexer::takeSExprStart(this,expected);
  if (bVar3) {
    typeidx<wasm::WATParser::ParseTypeDefsCtx>
              ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                *)local_b8,ctx);
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       *)local_50,
                      (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       *)local_b8);
    if (_val.val.
        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        ._M_u._24_1_ == '\x01') {
      x.val.
      super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
      ._32_8_ = &local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&x.val.
                         super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 + 0x20),local_50,
                 (undefined1 *)
                 ((long)_val.val.
                        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        ._M_u._M_first._M_storage.type.id + (long)local_50));
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err> +
               0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>
        .super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err> = puVar1;
      if ((undefined8 *)
          x.val.
          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          ._32_8_ == &local_80) {
        *puVar1 = local_80;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err> + 0x18) =
             uStack_78;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).
          super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err> =
             x.val.
             super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
             ._32_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err> + 0x10) =
             local_80;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err> + 8) =
           local_88;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err> + 0x20) =
           '\x02';
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                           *)local_50);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                           *)local_50);
      bVar3 = Lexer::takeRParen(this);
      if (bVar3) {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).
          super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err> = local_b8;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err> + 0x20) =
             '\0';
      }
      else {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"expected end of cont type","");
        Lexer::err((Err *)local_50,this,&local_70);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err> +
                 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).
          super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err> = puVar1;
        HVar2.id = (long)&_val.val.
                          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                   + 8;
        if (local_50 == (undefined1  [8])HVar2.id) {
          *puVar1 = CONCAT71(_val.val.
                             super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                             .
                             super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                             ._M_u._9_7_,
                             _val.val.
                             super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                             .
                             super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                             ._M_u._M_first._M_storage.exactness._0_1_);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err> + 0x18) =
               _val.val.
               super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               ._M_u._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).
            super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err> = local_50;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>
                    + 0x10) =
               CONCAT71(_val.val.
                        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        ._M_u._9_7_,
                        _val.val.
                        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        ._M_u._M_first._M_storage.exactness._0_1_);
        }
        ((HeapType *)
        ((long)&(__return_storage_ptr__->val).
                super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err> + 8))->id =
             (uintptr_t)
             _val.val.
             super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
             ._M_u._M_first._M_storage.type.id;
        _val.val.
        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        ._M_u._M_first._M_storage.type.id = (HeapType)0;
        _val.val.
        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        ._M_u._M_first._M_storage.exactness._0_1_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err> + 0x20) =
             '\x02';
        local_50 = (undefined1  [8])HVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         *)local_b8);
  }
  else {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err> + 0x20) =
         '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::ContinuationT> conttype(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("cont"sv)) {
    return {};
  }

  auto x = typeidx(ctx);
  CHECK_ERR(x);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of cont type");
  }

  return ctx.makeContType(*x);
}